

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingNegativeCase::LayoutBindingNegativeCase
          (LayoutBindingNegativeCase *this,Context *context,char *name,char *desc,
          ShaderType shaderType,TestType testType,ErrorType errorType,GLenum maxBindingPointEnum,
          GLenum maxVertexUnitsEnum,GLenum maxTessCtrlUnitsEnum,GLenum maxTessEvalUnitsEnum,
          GLenum maxFragmentUnitsEnum,GLenum maxCombinedUnitsEnum,string *uniformName)

{
  TestType testType_local;
  ShaderType shaderType_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  LayoutBindingNegativeCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__LayoutBindingNegativeCase_032c0fb0;
  this->m_program = (ShaderProgram *)0x0;
  this->m_shaderType = shaderType;
  this->m_testType = testType;
  this->m_errorType = errorType;
  this->m_maxBindingPointEnum = maxBindingPointEnum;
  this->m_maxVertexUnitsEnum = maxVertexUnitsEnum;
  this->m_maxFragmentUnitsEnum = maxFragmentUnitsEnum;
  this->m_maxTessCtrlUnitsEnum = maxTessCtrlUnitsEnum;
  this->m_maxTessEvalUnitsEnum = maxTessEvalUnitsEnum;
  this->m_maxCombinedUnitsEnum = maxCombinedUnitsEnum;
  std::__cxx11::string::string((string *)&this->m_uniformName,(string *)uniformName);
  this->m_numBindings = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->m_vertexShaderBinding);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_fragmentShaderBinding);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_tessCtrlShaderBinding);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_tessEvalShaderBinding);
  this->m_tessSupport = false;
  return;
}

Assistant:

LayoutBindingNegativeCase::LayoutBindingNegativeCase (Context&				context,
													  const char*			name,
													  const char*			desc,
													  ShaderType			shaderType,
													  TestType				testType,
													  ErrorType				errorType,
													  glw::GLenum			maxBindingPointEnum,
													  glw::GLenum			maxVertexUnitsEnum,
													  glw::GLenum			maxTessCtrlUnitsEnum,
													  glw::GLenum			maxTessEvalUnitsEnum,
													  glw::GLenum			maxFragmentUnitsEnum,
													  glw::GLenum			maxCombinedUnitsEnum,
													  const std::string&	uniformName)
	: TestCase					(context, name, desc)
	, m_program					(DE_NULL)
	, m_shaderType				(shaderType)
	, m_testType				(testType)
	, m_errorType				(errorType)
	, m_maxBindingPointEnum		(maxBindingPointEnum)
	, m_maxVertexUnitsEnum		(maxVertexUnitsEnum)
	, m_maxFragmentUnitsEnum	(maxFragmentUnitsEnum)
	, m_maxTessCtrlUnitsEnum	(maxTessCtrlUnitsEnum)
	, m_maxTessEvalUnitsEnum	(maxTessEvalUnitsEnum)
	, m_maxCombinedUnitsEnum	(maxCombinedUnitsEnum)
	, m_uniformName				(uniformName)
	, m_numBindings				(0)
	, m_tessSupport				(false)
{
}